

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O0

json __thiscall TestServerConnector::VerifyBatchResponse_abi_cxx11_(TestServerConnector *this)

{
  code *pcVar1;
  byte extraout_AL;
  json_value extraout_RDX;
  long in_RSI;
  double __x;
  json jVar2;
  bool local_125;
  ExpressionDecomposer local_124;
  Expression_lhs<bool> local_120;
  Result local_118;
  String local_f8;
  undefined1 local_e0 [8];
  ResultBuilder DOCTEST_RB;
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_40;
  undefined1 local_19;
  TestServerConnector *this_local;
  json *result;
  
  local_19 = 0;
  this_local = this;
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function(&local_40,(nullptr_t)0x0);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RSI + 8),&local_40,true,false);
  std::
  function<bool_(int,_nlohmann::detail::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_40);
  doctest::String::String(&local_f8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_e0,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x22,"result.is_array()","",&local_f8);
  doctest::String::~String(&local_f8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_124,DT_REQUIRE);
  local_125 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::is_array((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)this);
  local_120 = doctest::detail::ExpressionDecomposer::operator<<(&local_124,&local_125);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_118,(Expression_lhs *)&local_120);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_e0,&local_118);
  doctest::detail::Result::~Result(&local_118);
  doctest::detail::ResultBuilder::log((ResultBuilder *)local_e0,__x);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    jVar2 = (json)(*pcVar1)();
    return jVar2;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)local_e0);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_e0);
  jVar2.m_value.object = extraout_RDX.object;
  jVar2._0_8_ = this;
  return jVar2;
}

Assistant:

json VerifyBatchResponse() {
        json result = json::parse(raw_response);
        REQUIRE(result.is_array());
        return result;
    }